

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O3

void AddContent(QuadTreeNode *Tree,Container *NewContent,int divider)

{
  undefined8 *puVar1;
  double dVar2;
  Container *pCVar3;
  undefined1 auVar4 [16];
  double dVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  Container *pCVar9;
  QuadTreeNode *pQVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar7 = Separated(&((NewContent->Content).E)->Bounder,&Tree->Bounder);
  if (iVar7 == 0) {
    if (Tree->Children == (QuadTreeNode *)0x0) {
      iVar7 = Tree->NumContents + 1;
      Tree->NumContents = iVar7;
      pCVar3 = Tree->Contents;
      pCVar9 = (Container *)malloc(0x18);
      Tree->Contents = pCVar9;
      pCVar9->Content = NewContent->Content;
      pCVar9->Type = NewContent->Type;
      pCVar9->Next = pCVar3;
      if (((iVar7 == divider) &&
          ((double)screen_width < (Tree->Bounder).BR.Pos[0] - (Tree->Bounder).TL.Pos[0])) &&
         ((double)screen_height < (Tree->Bounder).BR.Pos[1] - (Tree->Bounder).TL.Pos[1])) {
        pQVar10 = (QuadTreeNode *)malloc(0x120);
        Tree->Children = pQVar10;
        uVar8 = 3;
        bVar6 = 1;
        lVar11 = 0;
        do {
          dVar14 = (Tree->Bounder).TL.Pos[0];
          dVar5 = dVar14;
          if ((bool)(bVar6 & 1)) {
            dVar5 = ((Tree->Bounder).BR.Pos[0] + dVar14) * 0.5;
          }
          dVar2 = (Tree->Bounder).TL.Pos[1];
          dVar12 = dVar2;
          if ((uVar8 & 2) != 0) {
            dVar12 = ((Tree->Bounder).BR.Pos[1] + dVar2) * 0.5;
          }
          dVar13 = (Tree->Bounder).BR.Pos[0];
          if (bVar6 == 0) {
            dVar13 = (dVar14 + dVar13) * 0.5;
          }
          dVar14 = (Tree->Bounder).BR.Pos[1];
          if ((uVar8 & 2) == 0) {
            dVar14 = (dVar2 + dVar14) * 0.5;
          }
          pQVar10 = Tree->Children;
          *(double *)((long)pQVar10[3].Bounder.TL.Pos + lVar11) = (double)(int)dVar5;
          auVar4._8_4_ = SUB84((double)(int)dVar13,0);
          auVar4._0_8_ = (double)(int)dVar12;
          auVar4._12_4_ = (int)((ulong)(double)(int)dVar13 >> 0x20);
          *(undefined1 (*) [16])((long)pQVar10[3].Bounder.TL.Pos + lVar11 + 8) = auVar4;
          *(double *)((long)pQVar10[3].Bounder.BR.Pos + lVar11 + 8) = (double)(int)dVar14;
          *(undefined4 *)((long)(&pQVar10[3].Bounder + 1) + lVar11) = 0;
          puVar1 = (undefined8 *)((long)(&pQVar10[3].Bounder + 1) + lVar11 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)(&pQVar10[3].Bounder + 1) + lVar11 + 0x18) = 0;
          lVar11 = lVar11 + -0x48;
          uVar8 = uVar8 - 1;
          bVar6 = bVar6 + 1;
        } while (lVar11 != -0x120);
        pCVar3 = Tree->Contents;
        while (pCVar3 != (Container *)0x0) {
          pCVar9 = pCVar3->Next;
          lVar11 = 0xd8;
          do {
            AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar11),pCVar3,
                       divider);
            lVar11 = lVar11 + -0x48;
          } while (lVar11 != -0x48);
          free(pCVar3);
          pCVar3 = pCVar9;
        }
        Tree->Contents = (Container *)0x0;
      }
    }
    else {
      lVar11 = 0xd8;
      do {
        AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar11),NewContent,
                   divider);
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x48);
    }
  }
  return;
}

Assistant:

static void AddContent(struct QuadTreeNode *Tree, struct Container *NewContent,
                int divider)
{
   int c;
   struct Container *CPtr, *Next;

   /*

      First check: does the refered new content actually overlap with this
      node? If not, do nothing

      NB: this code explicitly checks the bounding box of an 'edge' held in
      NewContent, even though it may hold an edge, triangle or object. This is
      fine because we've set up our structs so that the bounding box
      information is at the same location regardless

    */
   if (Separated(&NewContent->Content.E->Bounder, &Tree->Bounder))
      return;

   /*

      Second check: has this node been subdivided? If so, pass on for
      children to deal with

    */
   if (Tree->Children) {
      c = 4;
      while (c--)
         AddContent(&Tree->Children[c], NewContent, divider);
   } else {
      /*

         If we're here, then the edge really does need to be added to the
         current node, so do that

       */
      Tree->NumContents++;
      CPtr = Tree->Contents;
      Tree->Contents = (struct Container *)malloc(sizeof(struct Container));
      Tree->Contents->Content = NewContent->Content;
      Tree->Contents->Type = NewContent->Type;
      Tree->Contents->Next = CPtr;

      /*

         Now check if we've hit the maximum content count for this node. If
         so, subdivide

       */
      if ((Tree->NumContents == divider)
          && ((Tree->Bounder.BR.Pos[0] - Tree->Bounder.TL.Pos[0]) > screen_width)
          && ((Tree->Bounder.BR.Pos[1] - Tree->Bounder.TL.Pos[1]) > screen_height)) {
         /* allocate new memory and set up structures */
         Tree->Children =
            (struct QuadTreeNode *)malloc(sizeof(struct QuadTreeNode)
                                          * 4);
         c = 4;
         while (c--)
            SetupQuadTree(&Tree->Children[c],
                          GetX1(c, &Tree->Bounder), GetY1(c,
                                                          &Tree->
                                                          Bounder),
                          GetX2(c, &Tree->Bounder), GetY2(c, &Tree->Bounder));

         /* redistribute contents currently stored here */
         CPtr = Tree->Contents;
         while (CPtr) {
            Next = CPtr->Next;

            c = 4;
            while (c--)
               AddContent(&Tree->Children[c], CPtr, divider);

            free(CPtr);
            CPtr = Next;
         }
         Tree->Contents = NULL;
      }
   }
}